

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nxx.cpp
# Opt level: O3

bool mg::data::nxcx_decompress(Nxx *header,uint8_t *data,string *out)

{
  uint uVar1;
  uint8_t *local_98;
  ulong local_90;
  undefined8 uStack_88;
  pointer local_80;
  ulong uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  
  std::__cxx11::string::resize((ulong)out,(char)header->size);
  local_40 = 0;
  uStack_38 = 0;
  local_50 = 0;
  uStack_48 = 0;
  local_60 = 0;
  uStack_58 = 0;
  local_70 = 0;
  uStack_68 = 0;
  uStack_88 = 0;
  local_30 = 0;
  local_90 = (ulong)header->compressed_size;
  uStack_78 = (ulong)header->size;
  local_80 = (out->_M_dataplus)._M_p;
  local_98 = data;
  inflateInit_(&local_98,"1.2.11",0x70);
  uVar1 = inflate(&local_98,4);
  if ((uVar1 < 2) && (uVar1 = inflateEnd(&local_98), uVar1 == 0)) {
    return true;
  }
  fprintf(_stderr,"zlib error: %d: %s\n",(ulong)uVar1,uStack_68);
  return false;
}

Assistant:

bool nxcx_decompress(const Nxx &header, const uint8_t *data, std::string &out) {
  // Expand output to hold data
  out.resize(header.size);

  // Create inflate stream
  z_stream istream{};
  istream.avail_in = header.compressed_size;
  istream.next_in = const_cast<uint8_t *>(data);
  istream.avail_out = header.size;
  istream.next_out = reinterpret_cast<uint8_t *>(out.data());
  istream.total_out = 0;

  // Perform inflation
  inflateInit(&istream);
  const int err = inflate(&istream, Z_FINISH);
  if (err != Z_STREAM_END && err != Z_OK) {
    fprintf(stderr, "zlib error: %d: %s\n", err, istream.msg);
    return false;
  }
  const int err2 = inflateEnd(&istream);
  if (err2 != Z_OK) {
    fprintf(stderr, "zlib error: %d: %s\n", err2, istream.msg);
    return false;
  }

  return true;
}